

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O1

Type * __thiscall
QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>::operator()
          (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_> *this)

{
  long in_FS_OFFSET;
  Type *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>::guard._q_value.
            super___atomic_base<signed_char>._M_i < -1) {
    local_18 = (Type *)0x0;
  }
  else if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>>::
           instance()::holder == '\0') {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>>::operator()
              ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>> *)
               &local_18);
  }
  else {
    local_18 = (Type *)QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>>
                       ::instance()::holder;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

Type *operator()()
    {
        if (isDestroyed())
            return nullptr;
        return instance();
    }